

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMaybe.hpp
# Opt level: O1

Maybe<eglu::Error> * __thiscall
tcu::Maybe<eglu::Error>::operator=(Maybe<eglu::Error> *this,Error *val)

{
  if (this->m_ptr != (Error *)0x0) {
    (*(code *)**(undefined8 **)this->m_ptr)();
  }
  std::runtime_error::runtime_error((runtime_error *)(this->field_1).m_data,(runtime_error *)val);
  (this->field_1).m_align = (deUint64)&PTR__Exception_003e9d88;
  *(undefined1 **)((long)&this->field_1 + 0x10) = (undefined1 *)((long)&this->field_1 + 0x20);
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&this->field_1 + 0x10),*(long *)&val->field_0x10,
             *(long *)&val->field_0x18 + *(long *)&val->field_0x10);
  (this->field_1).m_align = (deUint64)&PTR__Exception_003eda10;
  *(undefined4 *)((long)&this->field_1 + 0x30) = *(undefined4 *)&val->field_0x30;
  (this->field_1).m_align = (deUint64)&PTR__Exception_003ed9e0;
  *(deUint32 *)((long)&this->field_1 + 0x34) = val->m_error;
  this->m_ptr = (Error *)&this->field_1;
  return this;
}

Assistant:

Maybe<T>& Maybe<T>::operator= (const T& val)
{
	if (m_ptr)
		m_ptr->~T();

	m_ptr = new(m_data)T(val);

	return *this;
}